

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_2_channels_with_1_coeff
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *local_138;
  float *local_120;
  stbir__contributors *local_118;
  float fStack_88;
  float fStack_84;
  __m128 d;
  __m128 c;
  __m128 tot;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  
  local_138 = output_buffer;
  local_120 = horizontal_coefficients;
  local_118 = horizontal_contributors;
  do {
    fStack_88 = (float)*(undefined8 *)(decode_buffer + local_118->n0 * 2);
    fStack_84 = (float)((ulong)*(undefined8 *)(decode_buffer + local_118->n0 * 2) >> 0x20);
    *(ulong *)local_138 = CONCAT44(fStack_84 * *local_120 + 0.0,fStack_88 * *local_120 + 0.0);
    local_120 = local_120 + coefficient_width;
    local_118 = local_118 + 1;
    local_138 = local_138 + 2;
  } while (local_138 < output_buffer + (output_sub_size << 1));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_1_coeff)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__1_coeff_only();
    stbir__store_output_tiny();
  } while ( output < output_end );
}